

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

sysbvm_bitflags_t sysbvm_function_getFlags(sysbvm_context_t *context,sysbvm_tuple_t function)

{
  _Bool _Var1;
  undefined8 local_20;
  sysbvm_tuple_t function_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isFunction(context,function);
  if (_Var1) {
    local_20 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(function + 0x28));
  }
  else {
    local_20 = 0;
  }
  return local_20;
}

Assistant:

SYSBVM_INLINE sysbvm_bitflags_t sysbvm_function_getFlags(sysbvm_context_t *context, sysbvm_tuple_t function)
{
    return sysbvm_tuple_isFunction(context, function) ? sysbvm_tuple_bitflags_decode(((sysbvm_function_t*)function)->flags) : 0;
}